

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O0

void mocker::anon_unknown_0::genArithBinary
               (Section *text,FuncSelectionContext *ctx,
               shared_ptr<mocker::ir::ArithBinaryInst> *inst)

{
  bool bVar1;
  OpType OVar2;
  int iVar3;
  element_type *peVar4;
  shared_ptr<mocker::nasm::Register> *psVar5;
  shared_ptr<mocker::ir::Reg> *psVar6;
  OpType *args;
  undefined1 local_260 [24];
  undefined1 local_248 [32];
  undefined1 local_228 [8];
  shared_ptr<mocker::nasm::Addr> dest;
  OpType local_210;
  OpType local_20c;
  float local_208;
  OpType local_204;
  OpType local_200;
  OpType local_1fc;
  OpType local_1f8;
  OpType local_1f4;
  float local_1f0;
  OpType local_1ec;
  pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType> local_1e8;
  pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType> local_1e0;
  pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType> local_1d8;
  pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType> local_1d0;
  pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType> local_1c8;
  pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType> local_1c0;
  initializer_list<std::pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType>_>
  local_1b8;
  OpType local_1a8;
  allocator<char> local_1a1;
  string local_1a0 [32];
  undefined1 local_180 [8];
  shared_ptr<mocker::nasm::Register> rcxCopy;
  shared_ptr<mocker::nasm::Addr> local_168;
  undefined1 local_158 [8];
  shared_ptr<mocker::nasm::Addr> rhs;
  shared_ptr<mocker::nasm::Addr> lhs_1;
  undefined1 local_128 [8];
  shared_ptr<mocker::nasm::Addr> dest_2;
  undefined1 local_108 [8];
  shared_ptr<mocker::nasm::Addr> dest_1;
  allocator<char> local_e1;
  string local_e0 [32];
  undefined1 local_c0 [8];
  shared_ptr<mocker::nasm::Register> divisor;
  shared_ptr<mocker::nasm::Addr> lhs;
  string local_98 [32];
  undefined1 local_78 [8];
  shared_ptr<mocker::nasm::Register> rdxCopy;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  shared_ptr<mocker::nasm::Register> raxCopy;
  shared_ptr<mocker::ir::ArithBinaryInst> *inst_local;
  FuncSelectionContext *ctx_local;
  Section *text_local;
  
  raxCopy.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)inst;
  peVar4 = std::
           __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)inst);
  OVar2 = ir::ArithBinaryInst::getOp(peVar4);
  if (OVar2 != Mod) {
    peVar4 = std::
             __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)raxCopy.
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    OVar2 = ir::ArithBinaryInst::getOp(peVar4);
    if (OVar2 != Div) {
      peVar4 = std::
               __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)raxCopy.
                               super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
      OVar2 = ir::ArithBinaryInst::getOp(peVar4);
      if (OVar2 != Shr) {
        peVar4 = std::
                 __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)raxCopy.
                                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
        OVar2 = ir::ArithBinaryInst::getOp(peVar4);
        if (OVar2 != Shl) {
          if (((anonymous_namespace)::
               genArithBinary(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::ArithBinaryInst>const&)
               ::opMp == '\0') &&
             (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                           genArithBinary(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::ArithBinaryInst>const&)
                                           ::opMp), iVar3 != 0)) {
            local_1ec = Add;
            local_1f0 = 4.2039e-45;
            std::pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType>::
            pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType,_true>
                      (&local_1e8,&local_1ec,(OpType *)&local_1f0);
            local_1f4 = Sub;
            local_1f8 = Sub;
            std::pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType>::
            pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType,_true>
                      (&local_1e0,&local_1f4,&local_1f8);
            local_1fc = Mul;
            local_200 = Mul;
            std::pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType>::
            pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType,_true>
                      (&local_1d8,&local_1fc,&local_200);
            local_204 = BitAnd;
            local_208 = 1.4013e-45;
            std::pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType>::
            pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType,_true>
                      (&local_1d0,&local_204,(OpType *)&local_208);
            local_20c = BitOr;
            local_210 = BitOr;
            std::pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType>::
            pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType,_true>
                      (&local_1c8,&local_20c,&local_210);
            dest.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._4_4_ = 2;
            dest.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._0_4_ = 2;
            std::pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType>::
            pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType,_true>
                      (&local_1c0,
                       (OpType *)
                       ((long)&dest.
                               super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 4),
                       (OpType *)
                       &dest.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            local_1b8._M_array = &local_1e8;
            local_1b8._M_len = 6;
            SmallMap<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType>::
            SmallMap(&genArithBinary::opMp,&local_1b8);
            __cxa_atexit(SmallMap<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType>
                         ::~SmallMap,&genArithBinary::opMp,&__dso_handle);
            __cxa_guard_release(&(anonymous_namespace)::
                                 genArithBinary(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::ArithBinaryInst>const&)
                                 ::opMp);
          }
          peVar4 = std::
                   __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)raxCopy.
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
          psVar6 = ir::Definition::getDest(&peVar4->super_Definition);
          std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                    ((shared_ptr<mocker::ir::Addr> *)(local_248 + 0x10),psVar6);
          FuncSelectionContext::getIrAddr
                    ((FuncSelectionContext *)local_228,(shared_ptr<mocker::ir::Addr> *)ctx);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                    ((shared_ptr<mocker::ir::Addr> *)(local_248 + 0x10));
          peVar4 = std::
                   __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)raxCopy.
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
          ir::ArithBinaryInst::getLhs(peVar4);
          FuncSelectionContext::getIrAddr
                    ((FuncSelectionContext *)local_248,(shared_ptr<mocker::ir::Addr> *)ctx);
          nasm::Section::
          emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>>
                    (text,(shared_ptr<mocker::nasm::Addr> *)local_228,
                     (shared_ptr<mocker::nasm::Addr> *)local_248);
          std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                    ((shared_ptr<mocker::nasm::Addr> *)local_248);
          peVar4 = std::
                   __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)raxCopy.
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
          local_260._20_4_ = ir::ArithBinaryInst::getOp(peVar4);
          args = SmallMap<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType>::at
                           (&genArithBinary::opMp,(OpType *)(local_260 + 0x14));
          peVar4 = std::
                   __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)raxCopy.
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
          ir::ArithBinaryInst::getRhs(peVar4);
          FuncSelectionContext::getIrAddr
                    ((FuncSelectionContext *)local_260,(shared_ptr<mocker::ir::Addr> *)ctx);
          nasm::Section::
          emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType_const&,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>>
                    (text,args,(shared_ptr<mocker::nasm::Addr> *)local_228,
                     (shared_ptr<mocker::nasm::Addr> *)local_260);
          std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                    ((shared_ptr<mocker::nasm::Addr> *)local_260);
          std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                    ((shared_ptr<mocker::nasm::Addr> *)local_228);
          return;
        }
      }
      peVar4 = std::
               __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)raxCopy.
                               super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
      psVar6 = ir::Definition::getDest(&peVar4->super_Definition);
      std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                ((shared_ptr<mocker::ir::Addr> *)
                 &lhs_1.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,psVar6);
      FuncSelectionContext::getIrAddr
                ((FuncSelectionContext *)local_128,(shared_ptr<mocker::ir::Addr> *)ctx);
      std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                ((shared_ptr<mocker::ir::Addr> *)
                 &lhs_1.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      peVar4 = std::
               __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)raxCopy.
                               super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
      ir::ArithBinaryInst::getLhs(peVar4);
      FuncSelectionContext::getIrAddr
                ((FuncSelectionContext *)
                 &rhs.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,(shared_ptr<mocker::ir::Addr> *)ctx);
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
                (text,(shared_ptr<mocker::nasm::Addr> *)local_128,
                 (shared_ptr<mocker::nasm::Addr> *)
                 &rhs.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      peVar4 = std::
               __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)raxCopy.
                               super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
      ir::ArithBinaryInst::getRhs(peVar4);
      FuncSelectionContext::getIrAddr
                ((FuncSelectionContext *)local_158,(shared_ptr<mocker::ir::Addr> *)ctx);
      nasm::dyc<mocker::nasm::NumericConstant,std::shared_ptr<mocker::nasm::Addr>&>(&local_168);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_168);
      std::shared_ptr<mocker::nasm::NumericConstant>::~shared_ptr
                ((shared_ptr<mocker::nasm::NumericConstant> *)&local_168);
      if (bVar1) {
        peVar4 = std::
                 __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)raxCopy.
                                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
        OVar2 = ir::ArithBinaryInst::getOp(peVar4);
        rcxCopy.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = OVar2 == Shr | 6;
        nasm::Section::
        emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
                  (text,(OpType *)
                        ((long)&rcxCopy.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi + 4),(shared_ptr<mocker::nasm::Addr> *)local_128,
                   (shared_ptr<mocker::nasm::Addr> *)local_158);
        rcxCopy.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._0_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_1a0,"",&local_1a1);
        FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_180,(string *)ctx);
        std::__cxx11::string::~string(local_1a0);
        std::allocator<char>::~allocator(&local_1a1);
        psVar5 = nasm::rcx();
        nasm::Section::
        emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
                  (text,(shared_ptr<mocker::nasm::Register> *)local_180,psVar5);
        psVar5 = nasm::rcx();
        nasm::Section::
        emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Addr>&>
                  (text,psVar5,(shared_ptr<mocker::nasm::Addr> *)local_158);
        peVar4 = std::
                 __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)raxCopy.
                                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
        OVar2 = ir::ArithBinaryInst::getOp(peVar4);
        local_1a8 = OVar2 == Shr | Sal;
        psVar5 = nasm::rcx();
        nasm::Section::
        emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Register>const&>
                  (text,&local_1a8,(shared_ptr<mocker::nasm::Addr> *)local_128,psVar5);
        psVar5 = nasm::rcx();
        nasm::Section::
        emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>&>
                  (text,psVar5,(shared_ptr<mocker::nasm::Register> *)local_180);
        rcxCopy.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._0_4_ = 1;
        std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Register> *)local_180);
      }
      std::shared_ptr<mocker::nasm::Addr>::~shared_ptr((shared_ptr<mocker::nasm::Addr> *)local_158);
      std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                ((shared_ptr<mocker::nasm::Addr> *)
                 &rhs.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::shared_ptr<mocker::nasm::Addr>::~shared_ptr((shared_ptr<mocker::nasm::Addr> *)local_128);
      return;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"",&local_51);
  FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_30,(string *)ctx);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"",
             (allocator<char> *)
             ((long)&lhs.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_78,(string *)ctx);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&lhs.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  psVar5 = nasm::rdx();
  nasm::Section::
  emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
            (text,(shared_ptr<mocker::nasm::Register> *)local_78,psVar5);
  psVar5 = nasm::rax();
  nasm::Section::
  emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
            (text,(shared_ptr<mocker::nasm::Register> *)local_30,psVar5);
  peVar4 = std::
           __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)raxCopy.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
  ir::ArithBinaryInst::getLhs(peVar4);
  FuncSelectionContext::getIrAddr
            ((FuncSelectionContext *)
             &divisor.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(shared_ptr<mocker::ir::Addr> *)ctx);
  psVar5 = nasm::rax();
  nasm::Section::
  emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Addr>&>
            (text,psVar5,
             (shared_ptr<mocker::nasm::Addr> *)
             &divisor.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  nasm::Section::emplaceInst<mocker::nasm::Cqo>(text);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"",&local_e1);
  FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_c0,(string *)ctx);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  peVar4 = std::
           __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)raxCopy.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
  ir::ArithBinaryInst::getRhs(peVar4);
  FuncSelectionContext::getIrAddr
            ((FuncSelectionContext *)
             &dest_1.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<mocker::ir::Addr> *)ctx);
  nasm::Section::
  emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Addr>>
            (text,(shared_ptr<mocker::nasm::Register> *)local_c0,
             (shared_ptr<mocker::nasm::Addr> *)
             &dest_1.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
            ((shared_ptr<mocker::nasm::Addr> *)
             &dest_1.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  nasm::Section::emplaceInst<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Register>&>
            (text,(shared_ptr<mocker::nasm::Register> *)local_c0);
  peVar4 = std::
           __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)raxCopy.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
  psVar6 = ir::Definition::getDest(&peVar4->super_Definition);
  std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
            ((shared_ptr<mocker::ir::Addr> *)
             &dest_2.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             psVar6);
  FuncSelectionContext::getIrAddr
            ((FuncSelectionContext *)local_108,(shared_ptr<mocker::ir::Addr> *)ctx);
  std::shared_ptr<mocker::ir::Addr>::~shared_ptr
            ((shared_ptr<mocker::ir::Addr> *)
             &dest_2.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  peVar4 = std::
           __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)raxCopy.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
  OVar2 = ir::ArithBinaryInst::getOp(peVar4);
  if (OVar2 == Mod) {
    psVar5 = nasm::rdx();
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Register>const&>
              (text,(shared_ptr<mocker::nasm::Addr> *)local_108,psVar5);
  }
  else {
    psVar5 = nasm::rax();
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Register>const&>
              (text,(shared_ptr<mocker::nasm::Addr> *)local_108,psVar5);
  }
  psVar5 = nasm::rdx();
  nasm::Section::
  emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>&>
            (text,psVar5,(shared_ptr<mocker::nasm::Register> *)local_78);
  psVar5 = nasm::rax();
  nasm::Section::
  emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>&>
            (text,psVar5,(shared_ptr<mocker::nasm::Register> *)local_30);
  std::shared_ptr<mocker::nasm::Addr>::~shared_ptr((shared_ptr<mocker::nasm::Addr> *)local_108);
  std::shared_ptr<mocker::nasm::Register>::~shared_ptr
            ((shared_ptr<mocker::nasm::Register> *)local_c0);
  std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
            ((shared_ptr<mocker::nasm::Addr> *)
             &divisor.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<mocker::nasm::Register>::~shared_ptr
            ((shared_ptr<mocker::nasm::Register> *)local_78);
  std::shared_ptr<mocker::nasm::Register>::~shared_ptr
            ((shared_ptr<mocker::nasm::Register> *)local_30);
  return;
}

Assistant:

void genArithBinary(nasm::Section &text, FuncSelectionContext &ctx,
                    const std::shared_ptr<ir::ArithBinaryInst> &inst) {
  if (inst->getOp() == ir::ArithBinaryInst::Mod ||
      inst->getOp() == ir::ArithBinaryInst::Div) {
    auto raxCopy = ctx.newVirtualReg(), rdxCopy = ctx.newVirtualReg();
    text.emplaceInst<nasm::Mov>(rdxCopy, nasm::rdx());
    text.emplaceInst<nasm::Mov>(raxCopy, nasm::rax());

    auto lhs = ctx.getIrAddr(inst->getLhs());
    text.emplaceInst<nasm::Mov>(nasm::rax(), lhs);
    text.emplaceInst<nasm::Cqo>();
    //    text.emplaceInst<nasm::Mov>(nasm::rdx(),
    //                                std::make_shared<nasm::NumericConstant>(0));

    auto divisor = ctx.newVirtualReg();
    text.emplaceInst<nasm::Mov>(divisor, ctx.getIrAddr(inst->getRhs()));
    text.emplaceInst<nasm::IDiv>(divisor);

    auto dest = ctx.getIrAddr(inst->getDest());
    if (inst->getOp() == ir::ArithBinaryInst::Mod)
      text.emplaceInst<nasm::Mov>(dest, nasm::rdx());
    else
      text.emplaceInst<nasm::Mov>(dest, nasm::rax());
    text.emplaceInst<nasm::Mov>(nasm::rdx(), rdxCopy);
    text.emplaceInst<nasm::Mov>(nasm::rax(), raxCopy);
    return;
  }

  if (inst->getOp() == ir::ArithBinaryInst::Shr ||
      inst->getOp() == ir::ArithBinaryInst::Shl) {
    auto dest = ctx.getIrAddr(inst->getDest());
    auto lhs = ctx.getIrAddr(inst->getLhs());
    text.emplaceInst<nasm::Mov>(dest, lhs);
    auto rhs = ctx.getIrAddr(inst->getRhs());

    if (nasm::dyc<nasm::NumericConstant>(rhs)) {
      text.emplaceInst<nasm::BinaryInst>(
          inst->getOp() == ir::ArithBinaryInst::Shr ? nasm::BinaryInst::Sar
                                                    : nasm::BinaryInst::Sal,
          dest, rhs);
      return;
    }

    auto rcxCopy = ctx.newVirtualReg();
    text.emplaceInst<nasm::Mov>(rcxCopy, nasm::rcx());
    text.emplaceInst<nasm::Mov>(nasm::rcx(), rhs);
    text.emplaceInst<nasm::BinaryInst>(inst->getOp() == ir::ArithBinaryInst::Shr
                                           ? nasm::BinaryInst::Sar
                                           : nasm::BinaryInst::Sal,
                                       dest, nasm::rcx());
    text.emplaceInst<nasm::Mov>(nasm::rcx(), rcxCopy);
    return;
  }

  static const SmallMap<ir::ArithBinaryInst::OpType, nasm::BinaryInst::OpType>
      opMp{
          {ir::ArithBinaryInst::Add, nasm::BinaryInst::Add},
          {ir::ArithBinaryInst::Sub, nasm::BinaryInst::Sub},
          {ir::ArithBinaryInst::Mul, nasm::BinaryInst::Mul},
          {ir::ArithBinaryInst::BitAnd, nasm::BinaryInst::BitAnd},
          {ir::ArithBinaryInst::BitOr, nasm::BinaryInst::BitOr},
          {ir::ArithBinaryInst::Xor, nasm::BinaryInst::Xor},
      };
  auto dest = ctx.getIrAddr(inst->getDest());
  text.emplaceInst<nasm::Mov>(dest, ctx.getIrAddr(inst->getLhs()));
  text.emplaceInst<nasm::BinaryInst>(opMp.at(inst->getOp()), dest,
                                     ctx.getIrAddr(inst->getRhs()));
}